

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O1

void __thiscall nesvis::PpuWidget::load_pattern_tables(PpuWidget *this)

{
  int i;
  long lVar1;
  Texture *pTVar2;
  Texture TStack_48;
  
  pTVar2 = (Texture *)&this->pattern_table_textures_;
  lVar1 = 0;
  do {
    PpuHelper::get_pattern_table_texture(&TStack_48,this->ppu_helper_,(uint16_t)lVar1,0,0);
    sf::Texture::operator=(pTVar2,&TStack_48);
    sf::Texture::~Texture(&TStack_48);
    lVar1 = lVar1 + 1;
    pTVar2 = pTVar2 + 1;
  } while (lVar1 != 0x100);
  pTVar2 = (Texture *)&(this->pattern_table_textures_).field_0x2800;
  lVar1 = 0;
  do {
    PpuHelper::get_pattern_table_texture(&TStack_48,this->ppu_helper_,(uint16_t)lVar1,1,0);
    sf::Texture::operator=(pTVar2,&TStack_48);
    sf::Texture::~Texture(&TStack_48);
    lVar1 = lVar1 + 1;
    pTVar2 = pTVar2 + 1;
  } while (lVar1 != 0x100);
  return;
}

Assistant:

void PpuWidget::load_pattern_tables() {
    const uint16_t palette = 0; // TODO(jn) update to correct index
    for (int i = 0; i < kPatternTableSize; ++i) {
        pattern_table_textures_[i] =
                ppu_helper_->get_pattern_table_texture(i, 0, palette);
    }

    for (int i = 0; i < kPatternTableSize; ++i) {
        pattern_table_textures_[kPatternTableSize + i] =
                ppu_helper_->get_pattern_table_texture(i, 1, palette);
    }
}